

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_word_follows
          (basic_substring<const_char> *this,size_t pos,csubstr word)

{
  basic_substring<const_char> bVar1;
  int iVar2;
  error_flags eVar3;
  ulong in_RCX;
  undefined8 in_RDX;
  ulong in_RSI;
  long *in_RDI;
  bool bVar4;
  size_t posend;
  size_t rnum;
  size_t in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  basic_substring<const_char> *in_stack_fffffffffffffe40;
  basic_substring<const_char> *this_00;
  ulong local_190;
  long *that;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 uVar5;
  undefined8 local_150;
  undefined8 local_148;
  basic_substring<const_char> *local_140;
  undefined8 local_128;
  ulong local_120;
  char *local_118;
  size_t local_110;
  char *local_108;
  undefined4 local_100;
  ulong local_f8;
  char *local_f0;
  undefined4 local_e8;
  char *local_e0;
  undefined4 local_d8;
  ulong local_d0;
  ulong local_c8;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  ulong local_a0;
  undefined8 *local_98;
  undefined8 local_90;
  ulong local_88;
  undefined8 local_70;
  char *local_60;
  size_t local_58;
  char *local_50;
  undefined4 local_48;
  basic_substring<const_char> *local_40;
  char *local_30;
  size_t local_28;
  char local_19;
  undefined8 *local_18;
  undefined8 local_10;
  ulong local_8;
  
  local_140 = (basic_substring<const_char> *)(in_RSI + in_RCX);
  uVar5 = false;
  that = in_RDI;
  if (local_140 <= (basic_substring<const_char> *)in_RDI[1]) {
    local_128 = in_RDX;
    local_120 = in_RCX;
    local_d0 = in_RCX;
    local_c8 = in_RSI;
    if ((ulong)in_RDI[1] < in_RSI) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        trap_instruction();
      }
      local_e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_d8 = 0x153a;
      handle_error(0x345f1b,(char *)0x153a,"check failed: %s","first >= 0 && first <= len");
    }
    if ((ulong)in_RDI[1] < local_d0 && local_d0 != 0xffffffffffffffff) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        trap_instruction();
      }
      local_f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_e8 = 0x153b;
      handle_error(0x345f1b,(char *)0x153b,"check failed: %s",
                   "(num >= 0 && num <= len) || (num == npos)");
    }
    if (local_d0 == 0xffffffffffffffff) {
      local_190 = in_RDI[1] - local_c8;
    }
    else {
      local_190 = local_d0;
    }
    local_f8 = local_190;
    if ((ulong)in_RDI[1] < local_c8 + local_190 && local_d0 != 0) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        trap_instruction();
      }
      local_108 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_100 = 0x153d;
      handle_error(0x345f1b,(char *)0x153d,"check failed: %s",
                   "(first >= 0 && first + rnum <= len) || (num == 0)");
    }
    basic_substring(in_stack_fffffffffffffe40,
                    (char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                    in_stack_fffffffffffffe30);
    local_150 = local_b8;
    local_148 = local_b0;
    local_90 = local_128;
    local_88 = local_120;
    local_98 = &local_150;
    local_a8 = local_128;
    local_a0 = local_120;
    local_10 = local_128;
    local_8 = local_120;
    local_18 = local_98;
    iVar2 = compare((basic_substring<const_char> *)CONCAT17(uVar5,in_stack_fffffffffffffe98),
                    (char *)that,(size_t)in_RDI);
    uVar5 = iVar2 == 0;
  }
  if ((bool)uVar5 == false) {
LAB_0027e6f5:
    local_70 = 0;
    basic_substring(in_stack_fffffffffffffe40,(char *)CONCAT17(1,in_stack_fffffffffffffe38),
                    (size_t)that);
    local_118 = local_60;
    local_110 = local_58;
  }
  else {
    if ((basic_substring<const_char> *)that[1] != local_140) {
      local_19 = *(char *)((long)&local_140->str + *that);
      bVar4 = true;
      if ((((((local_19 != ' ') && (bVar4 = true, local_19 != '\n')) &&
            (bVar4 = true, local_19 != ']')) &&
           ((bVar4 = true, local_19 != ')' && (bVar4 = true, local_19 != '}')))) &&
          ((bVar4 = true, local_19 != ',' &&
           ((bVar4 = true, local_19 != ';' && (bVar4 = true, local_19 != '\r')))))) &&
         (bVar4 = true, local_19 != '\t')) {
        bVar4 = local_19 == '\0';
      }
      if (!bVar4) goto LAB_0027e6f5;
    }
    local_40 = local_140;
    if ((basic_substring<const_char> *)that[1] < local_140 &&
        local_140 != (basic_substring<const_char> *)0xffffffffffffffff) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        trap_instruction();
      }
      local_50 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_48 = 0x154e;
      handle_error(0x345f1b,(char *)0x154e,"check failed: %s","num <= len || num == npos");
    }
    this_00 = local_40;
    if (local_40 == (basic_substring<const_char> *)0xffffffffffffffff) {
      this_00 = (basic_substring<const_char> *)that[1];
    }
    basic_substring(this_00,(char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                    in_stack_fffffffffffffe30);
    local_118 = local_30;
    local_110 = local_28;
  }
  bVar1.len = local_110;
  bVar1.str = local_118;
  return bVar1;
}

Assistant:

C4_NO_INLINE C4_PURE basic_substring _word_follows(size_t pos, csubstr word) const noexcept
    {
        size_t posend = pos + word.len;
        if(len >= posend && sub(pos, word.len) == word)
            if(len == posend || _is_delim_char(str[posend]))
                return first(posend);
        return first(0);
    }